

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.h
# Opt level: O0

void av1_calc_indices(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int dim)

{
  int in_ECX;
  uint8_t *in_RDX;
  int16_t *in_RSI;
  int16_t *in_RDI;
  int in_R8D;
  int in_R9D;
  
  if (in_R9D == 1) {
    (*av1_calc_indices_dim1)(in_RDI,in_RSI,in_RDX,(int64_t *)0x0,in_ECX,in_R8D);
  }
  else if (in_R9D == 2) {
    (*av1_calc_indices_dim2)(in_RDI,in_RSI,in_RDX,(int64_t *)0x0,in_ECX,in_R8D);
  }
  return;
}

Assistant:

static inline void av1_calc_indices(const int16_t *data,
                                    const int16_t *centroids, uint8_t *indices,
                                    int n, int k, int dim) {
  assert(n > 0);
  assert(k > 0);
  if (dim == 1) {
    av1_calc_indices_dim1(data, centroids, indices, /*total_dist=*/NULL, n, k);
  } else if (dim == 2) {
    av1_calc_indices_dim2(data, centroids, indices, /*total_dist=*/NULL, n, k);
  } else {
    assert(0 && "Untemplated k means dimension");
  }
}